

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O3

int __thiscall HttpConn::findCRLF(HttpConn *this,int start)

{
  pointer pcVar1;
  int iVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var3;
  
  pcVar1 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  _Var3 = std::
          __search<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (pcVar1 + start,pcVar1 + this->read_idx_,"\r\n","");
  iVar2 = -1;
  if (_Var3._M_current !=
      (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar2 = (int)_Var3._M_current - (int)pcVar1;
  }
  return iVar2;
}

Assistant:

int HttpConn::findCRLF(int start) const {
    auto beg = readBuff_.begin();
    auto it = std::search(beg + start, beg + read_idx_, CRLF, CRLF + 2);
    return it == readBuff_.end() ? -1 : it - beg;
}